

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

bool __thiscall Clasp::mt::ParallelSolve::requestWork(ParallelSolve *this,Solver *s,PathPtr *out)

{
  bool bVar1;
  Solver *in_RSI;
  Solver *in_RDI;
  Solver *unaff_retaddr;
  bool in_stack_00000017;
  Solver *in_stack_00000018;
  int popped;
  LitVec *a;
  SharedData *in_stack_00000040;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffffb8;
  Solver *in_stack_ffffffffffffffc0;
  int local_2c;
  pointer local_28;
  Solver *pSVar2;
  Solver *popped_00;
  uint32 in_stack_fffffffffffffffc;
  
  local_28 = (pointer)0x0;
  local_2c = 0;
  popped_00 = in_RDI;
  do {
    while( true ) {
      bVar1 = SharedData::terminate((SharedData *)0x21d19c);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return false;
      }
      local_2c = local_2c + 1;
      pSVar2 = in_RSI;
      if (local_2c == 1) break;
LAB_0021d1fd:
      in_RSI = pSVar2;
      bVar1 = SharedData::synchronize((SharedData *)0x21d20b);
      if (bVar1) {
        waitOnSync((ParallelSolve *)a,in_stack_00000018);
      }
      else if ((local_28 == (pointer)0x0) &&
              (local_28 = (pointer)SharedData::requestWork(in_stack_00000040,(Solver *)this),
              local_28 == (pointer)0x0)) {
        bVar1 = SharedData::synchronize((SharedData *)0x21d2a7);
        if (!bVar1) {
          terminate((ParallelSolve *)a,in_stack_00000018,in_stack_00000017);
        }
      }
      else {
        SingleOwnerPtr<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
        ::operator=((SingleOwnerPtr<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
                     *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        if (local_28 == (in_RDI->shared_->heuristic).entries_.ebo_.buf) {
          SingleOwnerPtr<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
          ::release((SingleOwnerPtr<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
                     *)in_stack_ffffffffffffffc0);
        }
        bVar1 = Solver::simplify(in_RDI);
        if (bVar1) {
          return true;
        }
        local_2c = 0;
      }
    }
    Solver::rootLevel(in_RSI);
    bVar1 = Solver::popRootLevel
                      (unaff_retaddr,in_stack_fffffffffffffffc,(LitVec *)popped_00,
                       SUB81((ulong)pSVar2 >> 0x38,0));
    in_stack_ffffffffffffffc0 = in_RSI;
    if (bVar1) goto LAB_0021d1fd;
    terminate((ParallelSolve *)a,in_stack_00000018,in_stack_00000017);
    in_stack_ffffffffffffffc0 = in_RSI;
    in_RSI = pSVar2;
  } while( true );
}

Assistant:

bool ParallelSolve::requestWork(Solver& s, PathPtr& out) {
	const LitVec* a = 0;
	for (int popped = 0; !shared_->terminate();) {
		// only clear path and stop conflict - we don't propagate() here
		// because we would then have to handle any eventual conflicts
		if (++popped == 1 && !s.popRootLevel(s.rootLevel())) {
			// s has a real top-level conflict - problem is unsat
			terminate(s, true);
		}
		else if (shared_->synchronize()) {
			// a synchronize request is active - we are fine with
			// this but did not yet have a chance to react on it
			waitOnSync(s);
		}
		else if (a || (a = shared_->requestWork(s)) != 0) {
			assert(s.decisionLevel() == 0);
			// got new work from work-queue
			out = a;
			// do not take over ownership of initial gp!
			if (a == shared_->path) { out.release(); }
			// propagate any new facts before starting new work
			if (s.simplify())       { return true; }
			// s now has a conflict - either an artificial stop conflict
			// or a real conflict - we'll handle it in the next iteration
			// via the call to popRootLevel()
			popped = 0;
		}
		else if (!shared_->synchronize()) {
			// no work left - quitting time?
			terminate(s, true);
		}
	}
	return false;
}